

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::AddParticle(ChParticleCloud *this,ChCoordsys<double> *initial_state)

{
  pointer *pppCVar1;
  iterator __position;
  ChAparticle *this_00;
  ChContactable_1vars<6> *pCVar2;
  ChAparticle *newp;
  ChAparticle *local_20;
  
  this_00 = (ChAparticle *)
            ChFrame<double>::operator_new((ChFrame<double> *)0x1a0,(size_t)initial_state);
  ChAparticle::ChAparticle(this_00);
  local_20 = this_00;
  ChFrame<double>::SetCoord((ChFrame<double> *)this_00,initial_state);
  this_00->container = this;
  __position._M_current =
       (this->particles).
       super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChAparticle*,std::allocator<chrono::ChAparticle*>>::
    _M_realloc_insert<chrono::ChAparticle*const&>
              ((vector<chrono::ChAparticle*,std::allocator<chrono::ChAparticle*>> *)&this->particles
               ,__position,&local_20);
    this_00 = local_20;
  }
  else {
    *__position._M_current = this_00;
    pppCVar1 = &(this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  pCVar2 = &this_00->super_ChContactable_1vars<6>;
  (this_00->variables).sharedmass = &this->particle_mass;
  (this_00->variables).super_ChVariablesBody.user_data = this;
  if (this_00 == (ChAparticle *)0x0) {
    pCVar2 = (ChContactable_1vars<6> *)0x0;
  }
  (*this_00->collision_model->_vptr_ChCollisionModel[0x16])(this_00->collision_model,pCVar2);
  (*local_20->collision_model->_vptr_ChCollisionModel[0x14])
            (local_20->collision_model,this->particle_collision_model);
  (*local_20->collision_model->_vptr_ChCollisionModel[4])();
  return;
}

Assistant:

void ChParticleCloud::AddParticle(ChCoordsys<double> initial_state) {
    ChAparticle* newp = new ChAparticle;
    newp->SetCoord(initial_state);

    newp->SetContainer(this);

    particles.push_back(newp);

    newp->variables.SetSharedMass(&particle_mass);
    newp->variables.SetUserData((void*)this);  // UserData unuseful in future parallel solver?

    newp->collision_model->SetContactable(newp);
    // newp->collision_model->ClearModel(); // wasn't already added to system, no need to remove
    newp->collision_model->AddCopyOfAnotherModel(particle_collision_model);
    newp->collision_model->BuildModel();  // will also add to system, if collision is on.
}